

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O1

exp_double __thiscall
ising::square::transfer_matrix::product_D<std::vector<double,std::allocator<double>>>
          (transfer_matrix *this,double beta,vector<double,_std::allocator<double>_> *inter_x,
          vector<double,_std::allocator<double>_> *field,vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  transfer_matrix *ptVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  pointer paVar8;
  int s;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  ulong in_XMM0_Qb;
  double dVar15;
  exp_double eVar16;
  vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_> weight;
  exp_number<double> local_a8;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  ulong uStack_80;
  vector<double,_std::allocator<double>_> *local_78;
  ulong local_70;
  transfer_matrix *local_68;
  vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_> local_60;
  double local_48;
  ulong uStack_40;
  
  uVar11 = (ulong)((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  *(undefined4 *)(this + 8) = 1;
  uVar7 = (uint)uVar11;
  uVar3 = 1 << ((byte)uVar11 & 0x1f);
  *(undefined8 *)this = 0;
  local_88 = beta;
  uStack_80 = in_XMM0_Qb;
  local_78 = v;
  std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::vector
            (&local_60,(long)(int)uVar7,(allocator_type *)&local_a8);
  dVar15 = *(double *)this;
  iVar12 = *(int *)(this + 8);
  local_70 = uVar11;
  local_68 = this;
  if (0 < (int)uVar7) {
    local_48 = -local_88;
    uStack_40 = uStack_80 ^ 0x8000000000000000;
    uVar11 = (ulong)(uVar7 & 0x7fffffff);
    lVar6 = 0;
    do {
      local_98 = ABS(*(double *)
                      ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar6) * local_88);
      uStack_90 = 0;
      standards::exp_number<double>::exp_number(&local_a8,local_98);
      iVar12 = iVar12 * local_a8.sign_;
      dVar15 = (double)(~-(ulong)(ABS((dVar15 + local_a8.log_) / local_a8.log_) < 1e-10) &
                       (ulong)(dVar15 + local_a8.log_));
      dVar14 = exp(*(double *)
                    ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar6) * local_88 - local_98);
      *(double *)
       ((long)(local_60.
               super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->elems + lVar6 * 2) = dVar14;
      dVar14 = exp(*(double *)
                    ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar6) * local_48 - local_98);
      *(double *)
       ((long)(local_60.
               super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->elems + lVar6 * 2 + 8) = dVar14;
      lVar6 = lVar6 + 8;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  *(double *)local_68 = dVar15;
  *(int *)(local_68 + 8) = iVar12;
  uVar7 = (uint)local_70;
  if (uVar7 != 0x1f) {
    pdVar1 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 1;
    if (1 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    uVar10 = 0;
    do {
      dVar15 = pdVar1[uVar10];
      if (0 < (int)uVar7) {
        uVar9 = 0;
        paVar8 = local_60.
                 super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar4 = (byte)uVar9;
          bVar13 = (local_70 & 0xffffffff) - 1 == uVar9;
          uVar9 = uVar9 + 1;
          bVar5 = (byte)uVar9;
          if (bVar13) {
            bVar5 = 0;
          }
          dVar15 = dVar15 * paVar8->elems
                            [((uint)uVar10 >> (bVar5 & 0x1f) ^ (uint)uVar10 >> (bVar4 & 0x1f)) & 1];
          paVar8 = paVar8 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar9);
      }
      pdVar1[uVar10] = dVar15;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar11);
  }
  if ((field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    dVar15 = *(double *)local_68;
    iVar12 = *(int *)(local_68 + 8);
    if (0 < (int)uVar7) {
      local_48 = -local_88;
      uStack_40 = uStack_80 ^ 0x8000000000000000;
      uVar11 = (ulong)(uVar7 & 0x7fffffff);
      lVar6 = 0;
      do {
        local_98 = ABS(*(double *)
                        ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar6) * local_88);
        uStack_90 = 0;
        standards::exp_number<double>::exp_number(&local_a8,local_98);
        iVar12 = iVar12 * local_a8.sign_;
        dVar15 = (double)(~-(ulong)(ABS((dVar15 + local_a8.log_) / local_a8.log_) < 1e-10) &
                         (ulong)(dVar15 + local_a8.log_));
        dVar14 = exp(*(double *)
                      ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar6) * local_88 - local_98);
        *(double *)
         ((long)(local_60.
                 super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->elems + lVar6 * 2) = dVar14;
        dVar14 = exp(*(double *)
                      ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar6) * local_48 - local_98);
        *(double *)
         ((long)(local_60.
                 super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->elems + lVar6 * 2 + 8) = dVar14;
        lVar6 = lVar6 + 8;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    *(double *)local_68 = dVar15;
    *(int *)(local_68 + 8) = iVar12;
    uVar7 = (uint)local_70;
    if (uVar7 != 0x1f) {
      pdVar1 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 1;
      if (1 < (int)uVar3) {
        uVar11 = (ulong)uVar3;
      }
      uVar10 = 0;
      do {
        dVar15 = pdVar1[uVar10];
        if (0 < (int)uVar7) {
          uVar9 = 0;
          paVar8 = local_60.
                   super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            dVar15 = dVar15 * paVar8->elems[((uint)uVar10 >> ((uint)uVar9 & 0x1f) & 1) != 0];
            uVar9 = uVar9 + 1;
            paVar8 = paVar8 + 1;
          } while ((uVar7 & 0x7fffffff) != uVar9);
        }
        pdVar1[uVar10] = dVar15;
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar11);
    }
  }
  ptVar2 = local_68;
  if (local_60.
      super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    dVar15 = extraout_XMM0_Qa;
  }
  eVar16._8_8_ = ptVar2;
  eVar16.log_ = dVar15;
  return eVar16;
}

Assistant:

static exp_double product_D(double beta, std::vector<double> const& inter_x,
                                   std::vector<double> const& field, VEC& v) {
    int width = inter_x.size();
    int dim = 1 << width;
    exp_double normal = 1;
    std::vector<boost::array<double, 2> > weight(width);
    for (int b = 0; b < width; ++b) {
      double offset = std::abs(beta * inter_x[b]);
      normal *= standards::exp_number<double>(offset);
      weight[b][0] = std::exp(beta * inter_x[b] - offset);
      weight[b][1] = std::exp(-beta * inter_x[b] - offset);
    }
    for (int c = 0; c < dim; ++c) {
      double elem = v[c];
      for (int b = 0; b < width; ++b) {
        int s0 = b;
        int s1 = (b+1) % width;
        elem *= weight[b][((c >> s0) & 1) ^ ((c >> s1) & 1)];
      }
      v[c] = elem;
    }
    if (field.size()) {
      for (int s = 0; s < width; ++s) {
        double offset = std::abs(beta * field[s]);
        normal *= standards::exp_number<double>(offset);
        weight[s][0] = std::exp(beta * field[s] - offset);
        weight[s][1] = std::exp(-beta * field[s] - offset);
      }
      for (int c = 0; c < dim; ++c) {
        double elem = v[c];
        for (int s = 0; s < width; ++s) elem *= weight[s][((c >> s) & 1)];
        v[c] = elem;
      }
    }
    return normal;
  }